

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdInt32x4FromFloat32x4<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  AsmJsSIMDValue bValue;
  SIMDValue SVar1;
  undefined8 local_50;
  Type local_48;
  undefined8 local_40;
  AsmJsSIMDValue result;
  AsmJsSIMDValue input;
  bool throws;
  OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  input.field_0.i8[0xf] = '\0';
  join_0x00000010_0x00000000_ =
       (anon_union_16_9_4d7543c8_for__SIMDValue_0)GetRegRawSimd<unsigned_int>(this,playout->F4_1);
  memset(&local_40,0,0x10);
  input.field_0.i8[0xf] = SIMDAnyNaN(this,(AsmJsSIMDValue *)((long)&result.field_0 + 8));
  if (!(bool)input.field_0.i8[0xf]) {
    SVar1 = SIMDInt32x4Operation::OpFromFloat32x4
                      ((SIMDValue *)((long)&result.field_0 + 8),(bool *)(input.field_0.i8 + 0xf));
    local_50 = SVar1.field_0._0_8_;
    local_40 = local_50;
    local_48 = SVar1.field_0._8_8_;
    result.field_0.i64[0] = local_48;
  }
  if ((input.field_0.u8[0xf] & 1) != 0) {
    JavascriptError::ThrowRangeError
              (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"SIMD.Int32x4.FromFloat32x4");
  }
  bValue.field_0.f64[1] = (Type)result.field_0.i64[0];
  bValue.field_0.f64[0] = (Type)local_40;
  SetRegRawSimd<unsigned_int>(this,playout->I4_0,bValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdInt32x4FromFloat32x4(const unaligned T* playout)
    {
        bool throws = false;
        AsmJsSIMDValue input = GetRegRawSimd(playout->F4_1);
        AsmJsSIMDValue result{ 0 };

#ifdef ENABLE_WASM_SIMD
        throws = SIMDAnyNaN(input);
        if (!throws)
#endif
        {
            result = SIMDInt32x4Operation::OpFromFloat32x4(input, throws);
        }

        // value is out of bound
        if (throws)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("SIMD.Int32x4.FromFloat32x4"));
        }
        SetRegRawSimd(playout->I4_0, result);
    }